

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void backtracer_printmsg(t_pd *who,t_symbol *s,int argc,t_atom *argv)

{
  char *pcVar1;
  size_t sVar2;
  int local_10c;
  char local_108 [8];
  char buf [100];
  int i;
  int nchar;
  int nprint;
  char msgbuf [104];
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_pd *who_local;
  
  local_10c = argc;
  if (5 < argc) {
    local_10c = 5;
  }
  pcVar1 = class_getname(*who);
  snprintf((char *)&nchar,100,"%s: %s ",pcVar1,s->s_name);
  sVar2 = strlen((char *)&nchar);
  buf._96_4_ = (undefined4)sVar2;
  buf[0x5c] = '\0';
  buf[0x5d] = '\0';
  buf[0x5e] = '\0';
  buf[0x5f] = '\0';
  for (; (int)buf._92_4_ < local_10c && (int)buf._96_4_ < 100; buf._92_4_ = buf._92_4_ + 1) {
    if ((int)buf._96_4_ < 100) {
      atom_string(argv + (int)buf._92_4_,local_108,100);
      snprintf((char *)((long)&nchar + (long)(int)buf._96_4_),(long)(100 - buf._96_4_)," %s",
               local_108);
      sVar2 = strlen((char *)&nchar);
      buf._96_4_ = (undefined4)sVar2;
    }
  }
  if ((local_10c < argc) && ((int)buf._96_4_ < 100)) {
    sprintf((char *)((long)&nchar + (long)(int)buf._96_4_),"...");
  }
  else {
    builtin_strncpy(msgbuf + 0x5c,"...",4);
  }
  logpost(who,2,"%s",&nchar);
  return;
}

Assistant:

static void backtracer_printmsg(t_pd *who, t_symbol *s,
    int argc, t_atom *argv)
{
    char msgbuf[104];
    int nprint = (argc > NARGS ? NARGS : argc), nchar, i;
    snprintf(msgbuf, 100, "%s: %s ", class_getname(*who), s->s_name);
    nchar = strlen(msgbuf);
    for (i = 0; i < nprint && nchar < 100; i++)
        if (nchar < 100)
    {
        char buf[100];
        atom_string(&argv[i], buf, 100);
        snprintf(msgbuf + nchar, 100-nchar, " %s", buf);
        nchar = strlen(msgbuf);
    }
    if (argc > nprint && nchar < 100)
        sprintf(msgbuf + nchar, "...");
    else memcpy(msgbuf+100, "...", 4); /* in case we didn't finish */
    logpost(who, 2, "%s", msgbuf);
}